

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void dequantize_row_q4_K(block_q4_K *x,float *y,int64_t k)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  byte bVar7;
  block_q4_K *pbVar8;
  uint8_t *puVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  int l;
  long lVar13;
  byte bVar14;
  bool bVar15;
  
  lVar6 = k + 0xff;
  if (-1 < k) {
    lVar6 = k;
  }
  uVar3 = (uint)((ulong)lVar6 >> 8);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pbVar8 = x + uVar4;
      puVar9 = pbVar8->qs;
      fVar1 = ggml_table_f32_f16[(pbVar8->field_0).field_0.d];
      fVar2 = ggml_table_f32_f16[(pbVar8->field_0).field_0.dmin];
      uVar10 = 0;
      uVar11 = 0;
      do {
        if (uVar10 < 4) {
          bVar12 = x[uVar4].scales[uVar10] & 0x3f;
          bVar14 = x[uVar4].scales[uVar10 + 4] & 0x3f;
          bVar5 = x[uVar4].scales[uVar10 + 1] & 0x3f;
          bVar7 = x[uVar4].scales[uVar10 + 5] & 0x3f;
        }
        else {
          bVar12 = x[uVar4].scales[uVar10 - 4] >> 2 & 0x30 | x[uVar4].scales[uVar10 + 4] & 0xf;
          bVar14 = x[uVar4].scales[uVar10] >> 2 & 0x30 | x[uVar4].scales[uVar10 + 4] >> 4;
          bVar5 = x[uVar4].scales[uVar10 - 3] >> 2 & 0x30 | x[uVar4].scales[uVar10 + 5] & 0xf;
          bVar7 = x[uVar4].scales[uVar10 + 1] >> 2 & 0x30 | x[uVar4].scales[uVar10 + 5] >> 4;
        }
        lVar6 = 0;
        lVar13 = 0;
        do {
          y[lVar13] = (float)(puVar9[lVar13] & 0xf) * (float)bVar12 * fVar1 + (float)bVar14 * -fVar2
          ;
          lVar13 = lVar13 + 1;
          lVar6 = lVar6 + -4;
        } while (lVar13 != 0x20);
        y = (float *)((long)y - lVar6);
        lVar6 = 0;
        do {
          *y = (float)(puVar9[lVar6] >> 4) * (float)bVar5 * fVar1 + (float)bVar7 * -fVar2;
          y = y + 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        puVar9 = puVar9 + 0x20;
        uVar10 = uVar10 + 2;
        bVar15 = uVar11 < 0xc0;
        uVar11 = uVar11 + 0x40;
      } while (bVar15);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar3 & 0x7fffffff));
  }
  return;
}

Assistant:

void dequantize_row_q4_K(const block_q4_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const uint8_t * q = x[i].qs;

        const float d   = GGML_FP16_TO_FP32(x[i].d);
        const float min = GGML_FP16_TO_FP32(x[i].dmin);

        int is = 0;
        uint8_t sc, m;
        for (int j = 0; j < QK_K; j += 64) {
            get_scale_min_k4(is + 0, x[i].scales, &sc, &m);
            const float d1 = d * sc; const float m1 = min * m;
            get_scale_min_k4(is + 1, x[i].scales, &sc, &m);
            const float d2 = d * sc; const float m2 = min * m;
            for (int l = 0; l < 32; ++l) *y++ = d1 * (q[l] & 0xF) - m1;
            for (int l = 0; l < 32; ++l) *y++ = d2 * (q[l]  >> 4) - m2;
            q += 32; is += 2;
        }
    }
}